

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::on_callback_change(void)

{
  bool bVar1;
  reference pCVar2;
  int *piVar3;
  Callback *callback;
  iterator __end1;
  iterator __begin1;
  CallbackVec *__range1;
  
  s_max_out_verbosity = -9;
  __end1 = std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::begin
                     ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  callback = (Callback *)
             std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::end
                       ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)s_callbacks);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
                                *)&callback);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
             ::operator*(&__end1);
    piVar3 = std::max<int>(&s_max_out_verbosity,&pCVar2->verbosity);
    s_max_out_verbosity = *piVar3;
    __gnu_cxx::
    __normal_iterator<loguru::Callback_*,_std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void on_callback_change()
	{
		s_max_out_verbosity = Verbosity_OFF;
		for (const auto& callback : s_callbacks) {
			s_max_out_verbosity = std::max(s_max_out_verbosity, callback.verbosity);
		}
	}